

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall tetgenio::load_ply(tetgenio *this,char *filebasename)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *result_1;
  size_t sVar4;
  FILE *__stream;
  byte *pbVar5;
  ulong uVar6;
  polygon *ppVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  byte *pbVar11;
  double *pdVar12;
  facet *pfVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  char *result_3;
  char *result_2;
  tetgenio *ptVar19;
  bool bVar20;
  double dVar21;
  char *bufferp;
  char infilename [1024];
  char buffer [2048];
  byte *local_c78;
  int local_c70;
  uint local_c6c;
  uint local_c68;
  uint local_c64;
  tetgenio *local_c60;
  long local_c58;
  long local_c50;
  FILE *local_c48;
  undefined8 local_c40;
  char local_c38 [4];
  undefined1 auStack_c34 [1019];
  undefined1 local_839;
  char local_838 [2056];
  
  strncpy(local_c38,filebasename,0x3ff);
  local_839 = 0;
  if (local_c38[0] == '\0') {
    puts("Error:  No filename.");
  }
  else {
    sVar4 = strlen(local_c38);
    iVar2 = strcmp(local_c38 + (sVar4 - 4),".ply");
    if (iVar2 != 0) {
      sVar4 = strlen(local_c38);
      builtin_strncpy(local_c38 + sVar4,".ply",4);
      auStack_c34[sVar4] = 0;
    }
    __stream = fopen(local_c38,"r");
    if (__stream == (FILE *)0x0) {
      printf("Error:  Unable to open file %s\n",local_c38);
    }
    else {
      iVar2 = printf("Opening %s.\n",local_c38);
      local_c6c = (uint)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
      uVar15 = 0;
      local_c70 = 0;
      local_c50 = 0;
      uVar16 = 0;
      local_c58 = 0;
      local_c64 = 0;
      uVar18 = 0;
      ptVar19 = this;
      local_c60 = this;
      local_c48 = __stream;
      uVar6 = uVar16;
LAB_00110c9d:
      do {
        local_c40 = uVar6;
        pbVar5 = (byte *)fgets(local_838,0x7ff,__stream);
        uVar3 = local_c64;
        while (uVar15 = uVar15 + 1, local_c64 = uVar3, pbVar5 != (byte *)0x0) {
          while( true ) {
            uVar6 = (ulong)*pbVar5;
            if (0x20 < uVar6) goto LAB_00110d12;
            if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) break;
            pbVar5 = pbVar5 + 1;
          }
          if ((0x2401UL >> (uVar6 & 0x3f) & 1) == 0) goto LAB_00110d12;
          pbVar5 = (byte *)fgets(local_838,0x7ff,__stream);
          uVar3 = local_c64;
        }
        pbVar5 = (byte *)0x0;
LAB_00110d12:
        iVar2 = (int)uVar16;
        local_c78 = pbVar5;
        if (pbVar5 == (byte *)0x0) {
LAB_0011133d:
          fclose(__stream);
          if (1 < uVar18) {
            printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)uVar18,local_c38);
            return false;
          }
          ptVar19->firstnumber = uVar18;
          if (iVar2 == (int)local_c50) {
            uVar16 = (ulong)local_c64;
            if (local_c64 == (uint)local_c58) {
              return true;
            }
            pcVar17 = "Expected %d faces, but read only %d faces in file %s\n";
            lVar8 = local_c58;
          }
          else {
            pcVar17 = "Expected %d vertices, but read only %d vertices in file %s\n";
            uVar16 = uVar16 & 0xffffffff;
            lVar8 = local_c50;
          }
          printf(pcVar17,lVar8,uVar16,local_c38);
          return false;
        }
        if ((local_c6c & 1) == 0) {
          if (iVar2 < (int)local_c50) {
            pdVar12 = ptVar19->pointlist;
            lVar8 = 0;
            do {
              if (*local_c78 == 0) {
                pcVar17 = "Syntax error reading vertex coords on line %d in file %s\n";
                goto LAB_001112e5;
              }
              dVar21 = strtod((char *)local_c78,(char **)&local_c78);
              pdVar12[iVar2 * 3 + lVar8] = dVar21;
              while ((0x2c < (ulong)*local_c78 ||
                     ((0x100900000201U >> ((ulong)*local_c78 & 0x3f) & 1) == 0))) {
                local_c78 = local_c78 + 1;
              }
LAB_00111025:
              uVar16 = (ulong)*local_c78;
              if (0x2e < uVar16) {
LAB_0011103a:
                if (0xf5 < (byte)(*local_c78 - 0x3a)) goto LAB_0011104a;
                local_c78 = local_c78 + 1;
                goto LAB_00111025;
              }
              if ((0x680000000001U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_0011104a;
              if (uVar16 != 0x23) goto LAB_0011103a;
              *local_c78 = 0;
LAB_0011104a:
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            uVar16 = (ulong)(iVar2 + 1);
            ptVar19 = local_c60;
            uVar6 = uVar16;
          }
          else {
            if ((int)local_c58 <= (int)uVar3) {
              printf("Found extra text starting at line %d in file %s\n",(ulong)uVar15,local_c38);
              goto LAB_0011133d;
            }
            pfVar13 = ptVar19->facetlist;
            pfVar13[(int)uVar3].polygonlist = (polygon *)0x0;
            pfVar13[(int)uVar3].holelist = (double *)0x0;
            pfVar13[(int)uVar3].numberofholes = 0;
            pfVar13[(int)uVar3].numberofpolygons = 1;
            local_c68 = uVar15;
            ppVar7 = (polygon *)operator_new__(0x10);
            pfVar13[(int)uVar3].polygonlist = ppVar7;
            ppVar7->vertexlist = (int *)0x0;
            ppVar7->numberofvertices = 0;
            lVar8 = strtol((char *)pbVar5,(char **)&local_c78,0);
            ppVar7->numberofvertices = (int)lVar8;
            if ((int)lVar8 == 0) {
              printf("Syntax error reading polygon on line %d in file %s\n",(ulong)local_c68,
                     local_c38);
              __stream = local_c48;
              goto LAB_001112f6;
            }
            uVar16 = (lVar8 << 0x20) >> 0x1e;
            if (lVar8 << 0x20 < 0) {
              uVar16 = 0xffffffffffffffff;
            }
            piVar9 = (int *)operator_new__(uVar16);
            uVar16 = local_c40;
            __stream = local_c48;
            uVar15 = local_c68;
            ppVar7->vertexlist = piVar9;
            if (0 < ppVar7->numberofvertices) {
              lVar8 = 0;
              uVar3 = uVar18;
              do {
                while ((0x2c < (ulong)*local_c78 ||
                       ((0x100900000201U >> ((ulong)*local_c78 & 0x3f) & 1) == 0))) {
                  local_c78 = local_c78 + 1;
                }
LAB_00110e07:
                uVar6 = (ulong)*local_c78;
                if (0x2e < uVar6) {
LAB_00110e1c:
                  if (0xf5 < (byte)(*local_c78 - 0x3a)) goto LAB_00110e2a;
                  local_c78 = local_c78 + 1;
                  goto LAB_00110e07;
                }
                if ((0x680000000001U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_00110e2a;
                if (uVar6 != 0x23) goto LAB_00110e1c;
                *local_c78 = 0;
LAB_00110e2a:
                if (*local_c78 == 0) {
                  pcVar17 = "Syntax error reading polygon on line %d in file %s\n";
                  goto LAB_001112e5;
                }
                lVar10 = strtol((char *)local_c78,(char **)&local_c78,0);
                uVar18 = (uint)lVar10;
                ppVar7->vertexlist[lVar8] = uVar18;
                if ((int)uVar3 < (int)uVar18) {
                  uVar18 = uVar3;
                }
                lVar8 = lVar8 + 1;
                uVar3 = uVar18;
              } while (lVar8 < ppVar7->numberofvertices);
            }
            local_c64 = local_c64 + 1;
            ptVar19 = local_c60;
            uVar6 = local_c40;
          }
          goto LAB_00110c9d;
        }
        pcVar17 = strstr((char *)pbVar5,"end_header");
        uVar6 = uVar16;
        if (((pcVar17 != (char *)0x0) ||
            (pcVar17 = strstr((char *)pbVar5,"End_header"), pcVar17 != (char *)0x0)) ||
           (pcVar17 = strstr((char *)pbVar5,"End_Header"), pcVar17 != (char *)0x0)) {
          local_c6c = 0;
          goto LAB_00110c9d;
        }
        if (((int)local_c50 == 0) || ((int)local_c58 == 0)) {
          pbVar11 = (byte *)strstr((char *)pbVar5,"element");
          if (pbVar11 == (byte *)0x0) {
            pbVar11 = (byte *)strstr((char *)pbVar5,"Element");
          }
          ptVar19 = local_c60;
          if (pbVar11 != (byte *)0x0) {
            while ((0x3b < (ulong)*pbVar11 ||
                   ((0x800100100000201U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))) {
              pbVar11 = pbVar11 + 1;
            }
            while( true ) {
              bVar1 = *pbVar11;
              if ((0x3b < (ulong)bVar1) || ((0x800100100000200U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
              break;
              pbVar11 = pbVar11 + 1;
            }
            local_c78 = pbVar11;
            if (bVar1 == 0) {
              pcVar17 = "Syntax error reading element type on line%d in file %s\n";
            }
            else {
              if ((int)local_c50 != 0) {
LAB_00110f6f:
                pbVar5 = local_c78;
                if ((int)local_c58 == 0) {
                  pbVar11 = (byte *)strstr((char *)local_c78,"face");
                  if (pbVar11 == (byte *)0x0) {
                    pbVar11 = (byte *)strstr((char *)pbVar5,"Face");
                  }
                  if (pbVar11 == (byte *)0x0) {
                    local_c58 = 0;
                  }
                  else {
                    while ((0x2c < (ulong)*pbVar11 ||
                           ((0x100900000201U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))) {
                      pbVar11 = pbVar11 + 1;
                    }
LAB_001111d6:
                    uVar14 = (ulong)*pbVar11;
                    if (0x2e < uVar14) {
LAB_001111f3:
                      if (0xf5 < (byte)(*pbVar11 - 0x3a)) goto LAB_0011127f;
                      pbVar11 = pbVar11 + 1;
                      goto LAB_001111d6;
                    }
                    if ((0x680000000001U >> (uVar14 & 0x3f) & 1) != 0) goto LAB_0011127f;
                    if (uVar14 != 0x23) goto LAB_001111f3;
                    *pbVar11 = 0;
LAB_0011127f:
                    local_c78 = pbVar11;
                    if (*pbVar11 == 0) {
                      pcVar17 = "Syntax error reading face number on line";
                      goto LAB_00111443;
                    }
                    local_c58 = strtol((char *)pbVar11,(char **)&local_c78,0);
                    uVar3 = (uint)local_c58;
                    if (0 < (int)uVar3) {
                      ptVar19->numberoffacets = uVar3;
                      pfVar13 = (facet *)operator_new__((ulong)(uVar3 & 0x7fffffff) << 5);
                      ptVar19->facetlist = pfVar13;
                    }
                  }
                }
                goto LAB_00111069;
              }
              pbVar5 = (byte *)strstr((char *)pbVar11,"vertex");
              if (pbVar5 == (byte *)0x0) {
                pbVar5 = (byte *)strstr((char *)pbVar11,"Vertex");
              }
              ptVar19 = local_c60;
              if (pbVar5 == (byte *)0x0) {
                local_c50 = 0;
                goto LAB_00110f6f;
              }
              while ((0x2c < (ulong)*pbVar5 ||
                     ((0x100900000201U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))) {
                pbVar5 = pbVar5 + 1;
              }
LAB_001111aa:
              uVar14 = (ulong)*pbVar5;
              if (0x2e < uVar14) {
LAB_001111bf:
                if (0xf5 < (byte)(*pbVar5 - 0x3a)) goto LAB_00111223;
                pbVar5 = pbVar5 + 1;
                goto LAB_001111aa;
              }
              if ((0x680000000001U >> (uVar14 & 0x3f) & 1) != 0) goto LAB_00111223;
              if (uVar14 != 0x23) goto LAB_001111bf;
              *pbVar5 = 0;
LAB_00111223:
              local_c78 = pbVar5;
              if (*pbVar5 != 0) {
                local_c50 = strtol((char *)pbVar5,(char **)&local_c78,0);
                iVar2 = (int)local_c50;
                if (0 < iVar2) {
                  ptVar19->numberofpoints = iVar2;
                  pdVar12 = (double *)operator_new__(local_c50 * 0x18 & 0x7fffffff8);
                  ptVar19->pointlist = pdVar12;
                  uVar18 = iVar2 + 1;
                }
                goto LAB_00110f6f;
              }
              pcVar17 = "Syntax error reading vertex number on line";
LAB_00111443:
              printf(pcVar17);
              pcVar17 = " %d in file %s\n";
            }
LAB_001112e5:
            printf(pcVar17,(ulong)uVar15,local_c38);
            goto LAB_001112f6;
          }
        }
LAB_00111069:
        pbVar5 = local_c78;
        bVar20 = local_c70 != 0;
        local_c70 = 1;
        if (bVar20) goto LAB_00110c9d;
        pbVar11 = (byte *)strstr((char *)local_c78,"format");
        if (pbVar11 == (byte *)0x0) {
          pbVar11 = (byte *)strstr((char *)pbVar5,"Format");
        }
        ptVar19 = local_c60;
        local_c70 = 0;
        if (pbVar11 == (byte *)0x0) goto LAB_00110c9d;
        while ((0x3b < (ulong)*pbVar11 ||
               ((0x800100100000201U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))) {
          pbVar11 = pbVar11 + 1;
        }
        while (((ulong)*pbVar11 < 0x3c &&
               ((0x800100100000200U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
          pbVar11 = pbVar11 + 1;
        }
        local_c78 = pbVar11;
        pcVar17 = strstr((char *)pbVar11,"ascii");
        local_c70 = 1;
        if (pcVar17 != (char *)0x0) goto LAB_00110c9d;
        pcVar17 = strstr((char *)pbVar11,"ASCII");
        local_c70 = 1;
      } while (pcVar17 != (char *)0x0);
      puts("This routine only reads ascii format of ply files.");
      puts("Hint: You can convert the binary to ascii format by");
      puts("  using the provided ply tools:");
      printf("  ply2ascii < %s > ascii_%s\n",local_c38);
LAB_001112f6:
      fclose(__stream);
    }
  }
  return false;
}

Assistant:

bool tetgenio::load_ply(char* filebasename)
{
  FILE *fp;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char buffer[INPUTLINESIZE];
  char *bufferp, *str;
  double *coord;
  int endheader = 0, format = 0;
  int nverts = 0, iverts = 0;
  int nfaces = 0, ifaces = 0;
  int line_count = 0, i;

  // Default, the ply file's index is from '0'. We check it by remembering the
  //   smallest index we found in the file. It should be either 0 or 1.
  int smallestidx = 0; 

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 4], ".ply") != 0) {
    strcat(infilename, ".ply");
  }

  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  while ((bufferp = readline(buffer, fp, &line_count)) != NULL) {
    if (!endheader) {
      // Find if it is the keyword "end_header".
      str = strstr(bufferp, "end_header");
      // strstr() is case sensitive.
      if (!str) str = strstr(bufferp, "End_header");
      if (!str) str = strstr(bufferp, "End_Header");
      if (str) {
        // This is the end of the header section.
        endheader = 1; 
        continue;
      }
      // Parse the number of vertices and the number of faces.
      if (nverts == 0 || nfaces == 0) {
        // Find if it si the keyword "element".
        str = strstr(bufferp, "element");
        if (!str) str = strstr(bufferp, "Element");
        if (str) {
          bufferp = findnextfield(str);
          if (*bufferp == '\0') {
            printf("Syntax error reading element type on line%d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          if (nverts == 0) {
            // Find if it is the keyword "vertex".
            str = strstr(bufferp, "vertex");
            if (!str) str = strstr(bufferp, "Vertex");
            if (str) {
              bufferp = findnextnumber(str);
              if (*bufferp == '\0') {
                printf("Syntax error reading vertex number on line");
                printf(" %d in file %s\n", line_count, infilename);
                fclose(fp);
                return false;
              }
              nverts = (int) strtol(bufferp, &bufferp, 0);
              // Allocate memory for 'tetgenio'
              if (nverts > 0) {
                numberofpoints = nverts;
                pointlist = new REAL[nverts * 3];
                smallestidx = nverts + 1; // A big enough index.
              }
            }
          }
          if (nfaces == 0) {
            // Find if it is the keyword "face".
            str = strstr(bufferp, "face");
            if (!str) str = strstr(bufferp, "Face");
            if (str) {
              bufferp = findnextnumber(str);
              if (*bufferp == '\0') {
                printf("Syntax error reading face number on line");
                printf(" %d in file %s\n", line_count, infilename);
                fclose(fp);
                return false;
              }
              nfaces = (int) strtol(bufferp, &bufferp, 0);
              // Allocate memory for 'tetgenio'
              if (nfaces > 0) {        
                numberoffacets = nfaces;
                facetlist = new tetgenio::facet[nfaces];
              }
            }
          }
        } // It is not the string "element". 
      }
      if (format == 0) {
        // Find the keyword "format".
        str = strstr(bufferp, "format");
        if (!str) str = strstr(bufferp, "Format");
        if (str) {
          format = 1;
          bufferp = findnextfield(str);
          // Find if it is the string "ascii".
          str = strstr(bufferp, "ascii");
          if (!str) str = strstr(bufferp, "ASCII");
          if (!str) {
            printf("This routine only reads ascii format of ply files.\n");
            printf("Hint: You can convert the binary to ascii format by\n");
            printf("  using the provided ply tools:\n");
            printf("  ply2ascii < %s > ascii_%s\n", infilename, infilename);
            fclose(fp);
            return false;
          }
        }
      }
    } else if (iverts < nverts) {
      // Read vertex coordinates
      coord = &pointlist[iverts * 3];
      for (i = 0; i < 3; i++) {
        if (*bufferp == '\0') {
          printf("Syntax error reading vertex coords on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        coord[i] = (REAL) strtod(bufferp, &bufferp);
        bufferp = findnextnumber(bufferp);
      }
      iverts++;
    } else if (ifaces < nfaces) {
      // Get next face
      f = &facetlist[ifaces];
      init(f);      
      // In .off format, each facet has one polygon, no hole.
      f->numberofpolygons = 1;
      f->polygonlist = new tetgenio::polygon[1];
      p = &f->polygonlist[0];
      init(p);
      // Read the number of vertices, it should be greater than 0.
      p->numberofvertices = (int) strtol(bufferp, &bufferp, 0);
      if (p->numberofvertices == 0) {
        printf("Syntax error reading polygon on line %d in file %s\n",
               line_count, infilename);
        fclose(fp);
        return false;
      }
      // Allocate memory for face vertices
      p->vertexlist = new int[p->numberofvertices];
      for (i = 0; i < p->numberofvertices; i++) {
        bufferp = findnextnumber(bufferp);
        if (*bufferp == '\0') {
          printf("Syntax error reading polygon on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        p->vertexlist[i] = (int) strtol(bufferp, &bufferp, 0);
        if (p->vertexlist[i] < smallestidx) {
          smallestidx = p->vertexlist[i];
        }
      }
      ifaces++;
    } else {
      // Should never get here
      printf("Found extra text starting at line %d in file %s\n", line_count,
             infilename);
      break;
    }
  }

  // Close file
  fclose(fp);

  // Decide the firstnumber of the index.
  if (smallestidx == 0) {
    firstnumber = 0;  
  } else if (smallestidx == 1) {
    firstnumber = 1;
  } else {
    printf("A wrong smallest index (%d) was detected in file %s\n",
           smallestidx, infilename);
    return false;
  }

  if (iverts != nverts) {
    printf("Expected %d vertices, but read only %d vertices in file %s\n",
           nverts, iverts, infilename);
    return false;
  }
  if (ifaces != nfaces) {
    printf("Expected %d faces, but read only %d faces in file %s\n",
           nfaces, ifaces, infilename);
    return false;
  }

  return true;
}